

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Options.h
# Opt level: O0

bool __thiscall Minisat::IntOption::parse(IntOption *this,char *str)

{
  bool bVar1;
  int iVar2;
  long lVar3;
  char *pcStack_30;
  int32_t tmp;
  char *end;
  char *span;
  char *str_local;
  IntOption *this_local;
  
  end = str;
  span = str;
  str_local = (char *)this;
  bVar1 = match<char_const*>(&end,"-");
  if (((bVar1) && (bVar1 = match<char_const*>(&end,(this->super_Option).name), bVar1)) &&
     (bVar1 = match<char_const*>(&end,"="), bVar1)) {
    lVar3 = strtol(end,&stack0xffffffffffffffd0,10);
    iVar2 = (int)lVar3;
    if (pcStack_30 == (char *)0x0) {
      this_local._7_1_ = false;
    }
    else {
      if ((this->range).end < iVar2) {
        fprintf(_stderr,"ERROR! value <%s> is too large for option \"%s\".\n",end,
                (this->super_Option).name);
        exit(1);
      }
      if (iVar2 < (this->range).begin) {
        fprintf(_stderr,"ERROR! value <%s> is too small for option \"%s\".\n",end,
                (this->super_Option).name);
        exit(1);
      }
      this->value = iVar2;
      this_local._7_1_ = true;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

virtual bool parse(const char* str){
        const char* span = str; 

        if (!match(span, "-") || !match(span, name) || !match(span, "="))
            return false;

        char*   end;
        int32_t tmp = strtol(span, &end, 10);

        if (end == NULL) 
            return false;
        else if (tmp > range.end){
            fprintf(stderr, "ERROR! value <%s> is too large for option \"%s\".\n", span, name);
            exit(1);
        }else if (tmp < range.begin){
            fprintf(stderr, "ERROR! value <%s> is too small for option \"%s\".\n", span, name);
            exit(1); }

        value = tmp;

        return true;
    }